

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

void __thiscall
re2::PCRE::Init(PCRE *this,char *pattern,Option options,int match_limit,int stack_limit,
               bool report_errors)

{
  ostringstream *poVar1;
  char *pcVar2;
  string *psVar3;
  size_t sVar4;
  LogMessage local_1b0;
  
  pcVar2 = (char *)(this->pattern_)._M_string_length;
  strlen(pattern);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pattern);
  this->options_ = options;
  this->match_limit_ = match_limit;
  this->stack_limit_ = stack_limit;
  this->hit_limit_ = 0;
  this->error_ = (string *)empty_string_abi_cxx11_;
  this->report_errors_ = report_errors;
  this->re_full_ = (pcre *)0x0;
  this->re_partial_ = (pcre *)0x0;
  if ((options & ~EnabledCompileOptions) == EnabledExecOptions) {
    Compile(this,UNANCHORED);
    this->re_partial_ = (pcre *)0x0;
  }
  else {
    psVar3 = (string *)operator_new(0x20);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"illegal regexp option","");
    this->error_ = psVar3;
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0x66,
               2);
    poVar1 = &local_1b0.str_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Error compiling \'",0x11);
    if (pattern == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
    }
    else {
      sVar4 = strlen(pattern);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pattern,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\': illegal regexp option",0x18);
    LogMessage::~LogMessage(&local_1b0);
  }
  return;
}

Assistant:

void PCRE::Init(const char* pattern, Option options, int match_limit,
              int stack_limit, bool report_errors) {
  pattern_ = pattern;
  options_ = options;
  match_limit_ = match_limit;
  stack_limit_ = stack_limit;
  hit_limit_ = false;
  error_ = &empty_string;
  report_errors_ = report_errors;
  re_full_ = NULL;
  re_partial_ = NULL;

  if (options & ~(EnabledCompileOptions | EnabledExecOptions)) {
    error_ = new string("illegal regexp option");
    PCREPORT(ERROR)
        << "Error compiling '" << pattern << "': illegal regexp option";
  } else {
    re_partial_ = Compile(UNANCHORED);
    if (re_partial_ != NULL) {
      re_full_ = Compile(ANCHOR_BOTH);
    }
  }
}